

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.h
# Opt level: O1

void lscpp::protocol::to_json(json *j,CompletionOptions *m)

{
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_50;
  pair<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_bool>
  local_40;
  
  local_50.m_type = null;
  local_50.m_value.object = (object_t *)0x0;
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(&local_50,true);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(&local_50,true);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::operator=(j,&local_50);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_50);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::emplace<char_const(&)[16],bool_const&>
            (&local_40,
             (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)j,(char (*) [16])"resolveProvider",&m->resolveProvider);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::
  emplace<char_const(&)[18],std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>
            (&local_40,
             (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)j,(char (*) [18])"triggerCharacters",&m->triggerCharacters);
  return;
}

Assistant:

void to_json(nlohmann::json &j, const CompletionOptions &m) {
  j = nlohmann::json{};
  j.emplace("resolveProvider", m.resolveProvider);
  j.emplace("triggerCharacters", m.triggerCharacters);
}